

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  bool bVar1;
  int iVar2;
  Size SVar3;
  CRef CVar4;
  Size SVar5;
  Size SVar6;
  vec<Minisat::Solver::Watcher,_int> *this_00;
  Lit *pLVar7;
  Clause *this_01;
  uint *puVar8;
  Solver *in_RDI;
  int j;
  int i;
  Var_conflict v_1;
  int i_1;
  int j_1;
  vec<Minisat::Solver::Watcher,_int> *ws;
  Lit p;
  int s;
  int v;
  ClauseAllocator *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  ClauseAllocator *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ClauseAllocator *in_stack_ffffffffffffff88;
  Solver *this_02;
  int local_40;
  Size local_3c;
  int local_30;
  int local_2c;
  int local_18;
  int local_14;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  for (local_14 = 0; iVar2 = nVars(in_RDI), local_14 < iVar2; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      mkLit(local_14,local_18 != 0);
      this_00 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                ::operator[]((OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                              *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (Lit *)in_stack_ffffffffffffff68);
      for (local_2c = 0; SVar3 = vec<Minisat::Solver::Watcher,_int>::size(this_00), local_2c < SVar3
          ; local_2c = local_2c + 1) {
        vec<Minisat::Solver::Watcher,_int>::operator[](this_00,local_2c);
        ClauseAllocator::reloc
                  ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   (CRef *)in_stack_ffffffffffffff78,
                   (ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
        ;
      }
    }
  }
  local_30 = 0;
  do {
    SVar3 = vec<Minisat::Lit,_int>::size(&in_RDI->trail);
    if (SVar3 <= local_30) {
      local_40 = 0;
      local_3c = 0;
      while (SVar3 = local_3c, SVar5 = vec<unsigned_int,_int>::size(&in_RDI->learnts), SVar3 < SVar5
            ) {
        vec<unsigned_int,_int>::operator[](&in_RDI->learnts,local_3c);
        bVar1 = isRemoved((Solver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (CRef)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        if (!bVar1) {
          in_stack_ffffffffffffff78 = &in_RDI->ca;
          vec<unsigned_int,_int>::operator[](&in_RDI->learnts,local_3c);
          ClauseAllocator::reloc
                    ((ClauseAllocator *)CONCAT44(SVar3,in_stack_ffffffffffffff80),
                     (CRef *)in_stack_ffffffffffffff78,
                     (ClauseAllocator *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          puVar8 = vec<unsigned_int,_int>::operator[](&in_RDI->learnts,local_3c);
          in_stack_ffffffffffffff80 = *puVar8;
          puVar8 = vec<unsigned_int,_int>::operator[](&in_RDI->learnts,local_40);
          *puVar8 = in_stack_ffffffffffffff80;
          local_40 = local_40 + 1;
        }
        local_3c = local_3c + 1;
      }
      vec<unsigned_int,_int>::shrink(&in_RDI->learnts,local_3c - local_40);
      local_40 = 0;
      local_3c = 0;
      while (SVar5 = local_3c, SVar6 = vec<unsigned_int,_int>::size(&in_RDI->clauses), SVar5 < SVar6
            ) {
        vec<unsigned_int,_int>::operator[](&in_RDI->clauses,local_3c);
        bVar1 = isRemoved((Solver *)CONCAT44(SVar5,in_stack_ffffffffffffff70),
                          (CRef)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        if (!bVar1) {
          in_stack_ffffffffffffff68 = &in_RDI->ca;
          vec<unsigned_int,_int>::operator[](&in_RDI->clauses,local_3c);
          ClauseAllocator::reloc
                    ((ClauseAllocator *)CONCAT44(SVar3,in_stack_ffffffffffffff80),
                     (CRef *)in_stack_ffffffffffffff78,
                     (ClauseAllocator *)CONCAT44(SVar5,in_stack_ffffffffffffff70));
          puVar8 = vec<unsigned_int,_int>::operator[](&in_RDI->clauses,local_3c);
          in_stack_ffffffffffffff70 = *puVar8;
          puVar8 = vec<unsigned_int,_int>::operator[](&in_RDI->clauses,local_40);
          *puVar8 = in_stack_ffffffffffffff70;
          local_40 = local_40 + 1;
        }
        local_3c = local_3c + 1;
      }
      vec<unsigned_int,_int>::shrink(&in_RDI->clauses,local_3c - local_40);
      return;
    }
    pLVar7 = vec<Minisat::Lit,_int>::operator[](&in_RDI->trail,local_30);
    Minisat::var((Lit)pLVar7->x);
    CVar4 = reason((Solver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (Var_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    if (CVar4 != 0xffffffff) {
      reason((Solver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (Var_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      this_01 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (CRef)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      bVar1 = Clause::reloced(this_01);
      if (!bVar1) {
        this_02 = (Solver *)&in_RDI->ca;
        reason((Solver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (Var_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (CRef)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        bVar1 = locked(this_02,(Clause *)in_stack_ffffffffffffff88);
        if (!bVar1) goto LAB_00a39dfc;
      }
      in_stack_ffffffffffffff88 = &in_RDI->ca;
      IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>::operator[]
                ((IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      ClauseAllocator::reloc
                ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (CRef *)in_stack_ffffffffffffff78,
                 (ClauseAllocator *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
LAB_00a39dfc:
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}